

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_mt_test.c
# Opt level: O0

void * thread_output(void *arg)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  RK_U32 size;
  MppBufferGroup pvVar6;
  uint local_184;
  undefined8 uStack_180;
  RK_S32 temporal_id;
  MppMeta meta;
  RK_U32 discard;
  RK_U32 err_info;
  RK_S32 log_len;
  RK_S32 log_size;
  char log_buf [256];
  MppBufferGroup grp;
  RK_U32 buf_size;
  RK_U32 ver_stride;
  RK_U32 hor_stride;
  RK_U32 height;
  RK_U32 width;
  MPP_RET ret;
  MppFrame frame;
  RK_U32 frm_eos;
  RK_U32 quiet;
  MppApi *mpi;
  MppCtx ctx;
  MpiDecTestCmd *cmd;
  MpiDecMtLoopData *data;
  void *arg_local;
  
  ctx = *arg;
  mpi = *(MppApi **)((long)arg + 8);
  _frm_eos = *(long *)((long)arg + 0x10);
  frame._4_4_ = *(int *)((long)arg + 0x68);
  cmd = (MpiDecTestCmd *)arg;
  data = (MpiDecMtLoopData *)arg;
  if (frame._4_4_ == 0) {
    _mpp_log_l(4,"mpi_dec_mt_test","get frame thread start\n",0);
  }
  do {
    frame._0_4_ = 0;
    _width = (MppFrame)0x0;
    iVar1 = (**(code **)(_frm_eos + 0x18))(mpi,&width);
    if (iVar1 == 0) {
      if (_width == (MppFrame)0x0) {
        usleep(1000);
      }
      else {
        iVar1 = mpp_frame_get_info_change(_width);
        if (iVar1 == 0) {
          err_info = 0xff;
          discard = 0;
          meta._4_4_ = mpp_frame_get_errinfo(_width);
          meta._0_4_ = mpp_frame_get_discard(_width);
          iVar1 = snprintf((char *)((long)&log_len + (long)(int)discard),
                           (long)(int)(err_info - discard),"decode get frame %d",
                           (ulong)*(uint *)(cmd->file_input + 0x58));
          discard = iVar1 + discard;
          iVar1 = mpp_frame_has_meta(_width);
          if (iVar1 != 0) {
            uStack_180 = mpp_frame_get_meta(_width);
            local_184 = 0;
            mpp_meta_get_s32(uStack_180,0x746c6964,&local_184);
            iVar1 = snprintf((char *)((long)&log_len + (long)(int)discard),
                             (long)(int)(err_info - discard)," tid %d",(ulong)local_184);
            discard = iVar1 + discard;
          }
          if ((meta._4_4_ != 0) || ((uint)meta != 0)) {
            iVar1 = snprintf((char *)((long)&log_len + (long)(int)discard),
                             (long)(int)(err_info - discard)," err %x discard %x",(ulong)meta._4_4_,
                             (ulong)(uint)meta);
            discard = iVar1 + discard;
          }
          if (frame._4_4_ == 0) {
            _mpp_log_l(4,"mpi_dec_mt_test","%p %s\n",0,mpi,&log_len);
          }
          *(int *)(cmd->file_input + 0x58) = *(int *)(cmd->file_input + 0x58) + 1;
          if ((*(long *)(cmd->file_input + 0x50) != 0) && (meta._4_4_ == 0)) {
            dump_mpp_frame_to_file(_width,*(FILE **)(cmd->file_input + 0x50));
          }
          fps_calc_inc(*(FpsCalc *)((long)ctx + 0x248));
        }
        else {
          uVar2 = mpp_frame_get_width(_width);
          uVar3 = mpp_frame_get_height(_width);
          uVar4 = mpp_frame_get_hor_stride(_width);
          uVar5 = mpp_frame_get_ver_stride(_width);
          size = mpp_frame_get_buf_size(_width);
          if (frame._4_4_ == 0) {
            _mpp_log_l(4,"mpi_dec_mt_test","decode_get_frame get info changed found\n",0);
          }
          if (frame._4_4_ == 0) {
            _mpp_log_l(4,"mpi_dec_mt_test",
                       "decoder require buffer w:h [%d:%d] stride [%d:%d] size %d\n",0,uVar2,uVar3,
                       uVar4,uVar5,size);
          }
          pvVar6 = dec_buf_mgr_setup(*(DecBufMgr *)(cmd->file_input + 0x28),size,0x18,
                                     *(MppDecBufMode *)((long)ctx + 0x230));
          iVar1 = (**(code **)(_frm_eos + 0x70))(mpi,0x310002,pvVar6);
          if (iVar1 != 0) {
            _mpp_log_l(2,"mpi_dec_mt_test","%p set buffer group failed ret %d\n",0,mpi,iVar1);
            goto LAB_00104e50;
          }
          *(MppBufferGroup *)(cmd->file_input + 0x30) = pvVar6;
          iVar1 = (**(code **)(_frm_eos + 0x70))(mpi,0x310003,0);
          if (iVar1 != 0) {
            _mpp_log_l(2,"mpi_dec_mt_test","info change ready failed ret %d\n",0,iVar1);
            goto LAB_00104e50;
          }
        }
        frame._0_4_ = mpp_frame_get_eos(_width);
        mpp_frame_deinit(&width);
        if (((0 < *(int *)(cmd->file_input + 0x5c)) &&
            (*(int *)(cmd->file_input + 0x5c) <= *(int *)(cmd->file_input + 0x58))) ||
           ((*(int *)(cmd->file_input + 0x5c) == 0 && ((int)frame != 0)))) {
          cmd->file_input[0x18] = '\x01';
          cmd->file_input[0x19] = '\0';
          cmd->file_input[0x1a] = '\0';
          cmd->file_input[0x1b] = '\0';
        }
      }
    }
    else {
      _mpp_log_l(2,"mpi_dec_mt_test","decode_get_frame failed ret %d\n",0,iVar1);
    }
    if (*(int *)(cmd->file_input + 0x18) != 0) {
LAB_00104e50:
      if (frame._4_4_ == 0) {
        _mpp_log_l(4,"mpi_dec_mt_test","get frame thread end\n",0);
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void *thread_output(void *arg)
{
    MpiDecMtLoopData *data = (MpiDecMtLoopData *)arg;
    MpiDecTestCmd *cmd = data->cmd;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    RK_U32 quiet = data->quiet;

    mpp_log_q(quiet, "get frame thread start\n");

    // then get all available frame and release
    do {
        RK_U32 frm_eos = 0;
        MppFrame frame = NULL;
        MPP_RET ret = mpi->decode_get_frame(ctx, &frame);

        if (ret) {
            mpp_err("decode_get_frame failed ret %d\n", ret);
            continue;
        }

        if (NULL == frame) {
            msleep(1);
            continue;
        }

        if (mpp_frame_get_info_change(frame)) {
            // found info change and create buffer group for decoding
            RK_U32 width = mpp_frame_get_width(frame);
            RK_U32 height = mpp_frame_get_height(frame);
            RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
            RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
            RK_U32 buf_size = mpp_frame_get_buf_size(frame);
            MppBufferGroup grp = NULL;

            mpp_log_q(quiet, "decode_get_frame get info changed found\n");
            mpp_log_q(quiet, "decoder require buffer w:h [%d:%d] stride [%d:%d] size %d\n",
                      width, height, hor_stride, ver_stride, buf_size);

            grp = dec_buf_mgr_setup(data->buf_mgr, buf_size, 24, cmd->buf_mode);
            /* Set buffer to mpp decoder */
            ret = mpi->control(ctx, MPP_DEC_SET_EXT_BUF_GROUP, grp);
            if (ret) {
                mpp_err("%p set buffer group failed ret %d\n", ctx, ret);
                break;
            }
            data->frm_grp = grp;

            ret = mpi->control(ctx, MPP_DEC_SET_INFO_CHANGE_READY, NULL);
            if (ret) {
                mpp_err("info change ready failed ret %d\n", ret);
                break;
            }
        } else {
            char log_buf[256];
            RK_S32 log_size = sizeof(log_buf) - 1;
            RK_S32 log_len = 0;
            RK_U32 err_info = mpp_frame_get_errinfo(frame);
            RK_U32 discard = mpp_frame_get_discard(frame);

            log_len += snprintf(log_buf + log_len, log_size - log_len,
                                "decode get frame %d", data->frame_count);

            if (mpp_frame_has_meta(frame)) {
                MppMeta meta = mpp_frame_get_meta(frame);
                RK_S32 temporal_id = 0;

                mpp_meta_get_s32(meta, KEY_TEMPORAL_ID, &temporal_id);

                log_len += snprintf(log_buf + log_len, log_size - log_len,
                                    " tid %d", temporal_id);
            }

            if (err_info || discard) {
                log_len += snprintf(log_buf + log_len, log_size - log_len,
                                    " err %x discard %x", err_info, discard);
            }
            mpp_log_q(quiet, "%p %s\n", ctx, log_buf);

            data->frame_count++;
            if (data->fp_output && !err_info)
                dump_mpp_frame_to_file(frame, data->fp_output);

            fps_calc_inc(cmd->fps);
        }

        frm_eos = mpp_frame_get_eos(frame);
        mpp_frame_deinit(&frame);

        if ((data->frame_num > 0 && (data->frame_count >= data->frame_num)) ||
            ((data->frame_num == 0) && frm_eos))
            data->loop_end = 1;
    } while (!data->loop_end);

    mpp_log_q(quiet, "get frame thread end\n");

    return NULL;
}